

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError
parse_header(GlobalConfig *global,OperationConfig *config,cmdline_t cmd,char *nextarg)

{
  _Bool _Var1;
  int iVar2;
  char *ptr_00;
  curl_slist **local_78;
  FILE *local_70;
  char *ptr;
  undefined1 local_58 [7];
  _Bool error;
  dynbuf line;
  FILE *file;
  _Bool use_stdin;
  ParameterError err;
  char *nextarg_local;
  cmdline_t cmd_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  file._4_4_ = PARAM_OK;
  if (*nextarg == '@') {
    iVar2 = strcmp(nextarg + 1,"-");
    if (iVar2 != 0) {
      local_70 = fopen64(nextarg + 1,"r");
    }
    else {
      local_70 = _stdin;
    }
    line.toobig = (size_t)local_70;
    if (local_70 == (FILE *)0x0) {
      errorf(global,"Failed to open %s",nextarg + 1);
      file._4_4_ = PARAM_READ_ERROR;
    }
    else {
      ptr._7_1_ = 0;
      curlx_dyn_init((dynbuf *)local_58,0x19000);
      do {
        _Var1 = my_get_line((FILE *)line.toobig,(dynbuf *)local_58,(_Bool *)((long)&ptr + 7));
        if (!_Var1) break;
        ptr_00 = curlx_dyn_ptr((dynbuf *)local_58);
        if (cmd == C_PROXY_HEADER) {
          local_78 = &config->proxyheaders;
        }
        else {
          local_78 = &config->headers;
        }
        file._4_4_ = add2list(local_78,ptr_00);
      } while (file._4_4_ == PARAM_OK);
      if ((ptr._7_1_ & 1) != 0) {
        file._4_4_ = PARAM_READ_ERROR;
      }
      curlx_dyn_free((dynbuf *)local_58);
      if (iVar2 != 0) {
        fclose((FILE *)line.toobig);
      }
    }
  }
  else if (cmd == C_PROXY_HEADER) {
    file._4_4_ = add2list(&config->proxyheaders,nextarg);
  }
  else {
    file._4_4_ = add2list(&config->headers,nextarg);
  }
  return file._4_4_;
}

Assistant:

static ParameterError parse_header(struct GlobalConfig *global,
                                   struct OperationConfig *config,
                                   cmdline_t cmd,
                                   const char *nextarg)
{
  ParameterError err = PARAM_OK;

  /* A custom header to append to a list */
  if(nextarg[0] == '@') {
    /* read many headers from a file or stdin */
    bool use_stdin = !strcmp(&nextarg[1], "-");
    FILE *file = use_stdin ? stdin : fopen(&nextarg[1], FOPEN_READTEXT);
    if(!file) {
      errorf(global, "Failed to open %s", &nextarg[1]);
      err = PARAM_READ_ERROR;
    }
    else {
      struct dynbuf line;
      bool error = FALSE;
      curlx_dyn_init(&line, 1024*100);
      while(my_get_line(file, &line, &error)) {
        const char *ptr = curlx_dyn_ptr(&line);
        err = add2list(cmd == C_PROXY_HEADER ? /* --proxy-header? */
                       &config->proxyheaders :
                       &config->headers, ptr);
        if(err)
          break;
      }
      if(error)
        err = PARAM_READ_ERROR;
      curlx_dyn_free(&line);
      if(!use_stdin)
        fclose(file);
    }
  }
  else {
    if(cmd == C_PROXY_HEADER) /* --proxy-header */
      err = add2list(&config->proxyheaders, nextarg);
    else
      err = add2list(&config->headers, nextarg);
  }
  return err;
}